

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatTimeInMillisAsSeconds_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  uint *puVar1;
  long lVar2;
  ulong uVar3;
  stringstream ss;
  stringstream asStack_198 [16];
  long local_188;
  long local_180 [2];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 4;
  if (((long)this * 0x1cac083126e978d5 + 0x10624dd2f1a9fb8U >> 3 |
      (long)this * 0x1cac083126e978d5 << 0x3d) < 0x4189374bc6a7ef) {
    lVar2 = 0;
  }
  else if (((long)this * -0x70a3d70a3d70a3d7 + 0x51eb851eb851eb8U >> 2 |
           (long)this * -0x70a3d70a3d70a3d7 << 0x3e) < 0x28f5c28f5c28f5d) {
    lVar2 = 1;
  }
  else {
    uVar3 = (long)this * -0x3333333333333333 + 0x1999999999999998;
    lVar2 = 3 - (ulong)((uVar3 >> 1 | (ulong)((uVar3 & 1) != 0) << 0x3f) < 0x1999999999999999);
  }
  *(long *)((long)local_180 + *(long *)(local_188 + -0x18)) = lVar2;
  puVar1 = (uint *)((long)auStack_170 + *(long *)(local_188 + -0x18));
  *puVar1 = *puVar1 | 0x400;
  std::ostream::_M_insert<double>((double)(long)this * 0.001);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatTimeInMillisAsSeconds(TimeInMillis ms) {
  ::std::stringstream ss;
  // For the exact N seconds, makes sure output has a trailing decimal point.
  // Sets precision so that we won't have many trailing zeros (e.g., 300 ms
  // will be just 0.3, 410 ms 0.41, and so on)
  ss << std::fixed
     << std::setprecision(
            ms % 1000 == 0 ? 0 : (ms % 100 == 0 ? 1 : (ms % 10 == 0 ? 2 : 3)))
     << std::showpoint;
  ss << (static_cast<double>(ms) * 1e-3);
  return ss.str();
}